

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PA5Application.cpp
# Opt level: O0

void __thiscall
PA5Application::RenderObjectPart::draw
          (RenderObjectPart *this,Sampler *colormap,Sampler *normalmap,Sampler *specularmap)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *this_00;
  Sampler *specularmap_local;
  Sampler *normalmap_local;
  Sampler *colormap_local;
  RenderObjectPart *this_local;
  
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  (**(peVar1->super_OGLStateObject)._vptr_OGLStateObject)();
  peVar2 = std::__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_diffuseTexture);
  Sampler::attachTexture(colormap,peVar2);
  peVar2 = std::__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_normalTexture);
  Sampler::attachTexture(normalmap,peVar2);
  peVar2 = std::__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Texture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_specularTexture);
  Sampler::attachTexture(specularmap,peVar2);
  this_00 = std::__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<VAO,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  VAO::draw(this_00,4);
  peVar1 = std::__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Program,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->m_program);
  (*(peVar1->super_OGLStateObject)._vptr_OGLStateObject[1])();
  return;
}

Assistant:

void PA5Application::RenderObjectPart::draw(Sampler * colormap, Sampler * normalmap, Sampler * specularmap)
{
  m_program->bind();
  colormap->attachTexture(*m_diffuseTexture);
  normalmap->attachTexture(*m_normalTexture);
  specularmap->attachTexture(*m_specularTexture);
  m_vao->draw();
  m_program->unbind();
}